

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  Ch *pCVar1;
  Ch *pCVar2;
  
  pCVar1 = is->src_;
  if (*pCVar1 != 't') {
    __assert_fail("is.Peek() == \'t\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x364,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  pCVar2 = pCVar1 + 1;
  is->src_ = pCVar2;
  if (pCVar1[1] == 'r') {
    pCVar2 = pCVar1 + 2;
    is->src_ = pCVar2;
    if (pCVar1[2] == 'u') {
      pCVar2 = pCVar1 + 3;
      is->src_ = pCVar2;
      if (pCVar1[3] == 'e') {
        is->src_ = pCVar1 + 4;
        return;
      }
    }
  }
  if (*(int *)(this + 0x30) == 0) {
    pCVar1 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar2 - (long)pCVar1;
    return;
  }
  __assert_fail("!HasParseError()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                ,0x36c,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
               );
}

Assistant:

void ParseTrue(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 't');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'r') && Consume(is, 'u') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(true)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }